

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall FIX::Session::nextLogout(Session *this,Message *logout,UtcTimeStamp *now)

{
  SessionState *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  int iVar3;
  uchar *in_R8;
  size_t in_R9;
  string local_38;
  
  iVar3 = verify(this,(EVP_PKEY_CTX *)logout,(uchar *)0x0,0,in_R8,in_R9);
  if ((char)iVar3 != '\0') {
    this_00 = &this->m_state;
    paVar1 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if ((this->m_state).m_sentLogout == false) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Received logout request","");
      SessionState::onEvent(this_00,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != paVar1) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      local_38._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
      generateLogout(this,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != paVar1) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      local_38._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Sending logout response","");
      SessionState::onEvent(this_00,&local_38);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Received logout response","");
      SessionState::onEvent(this_00,&local_38);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    SessionState::incrNextTargetMsgSeqNum(this_00);
    if (this->m_resetOnLogout == true) {
      if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar2 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != paVar1) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar2);
      }
      (*(this->m_timestamper)._M_invoker)
                ((UtcTimeStamp *)&local_38,(_Any_data *)&this->m_timestamper);
      SessionState::reset(this_00,(UtcTimeStamp *)&local_38);
    }
    disconnect(this);
  }
  return;
}

Assistant:

void Session::nextLogout(const Message &logout, const UtcTimeStamp &now) {
  if (!verify(logout, false, false)) {
    return;
  }
  if (!m_state.sentLogout()) {
    m_state.onEvent("Received logout request");
    generateLogout();
    m_state.onEvent("Sending logout response");
  } else {
    m_state.onEvent("Received logout response");
  }

  m_state.incrNextTargetMsgSeqNum();
  if (m_resetOnLogout) {
    m_state.reset(m_timestamper());
  }
  disconnect();
}